

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
BuildWithDepsLogTestDepFileOKDepsLog::Run(BuildWithDepsLogTestDepFileOKDepsLog *this)

{
  VirtualFileSystem *this_00;
  BuildConfig *config;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  Edge *this_01;
  Test *pTVar4;
  _Head_base<0UL,_CommandRunner_*,_false> _Var5;
  bool bVar6;
  bool condition;
  int iVar7;
  LoadStatus LVar8;
  Node *pNVar9;
  _Head_base<0UL,_CommandRunner_*,_false> _Var10;
  StringPiece path;
  string err;
  Builder builder;
  DepsLog deps_log;
  State state;
  string local_2d8;
  string local_2b8;
  BuildConfig *local_298;
  undefined1 local_290 [128];
  _Head_base<0UL,_CommandRunner_*,_false> local_210;
  string local_1b8;
  DepsLog local_198;
  undefined1 local_138 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  local_100;
  pointer local_d0;
  pointer local_c8;
  pointer local_c0;
  undefined **local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  local_80;
  pointer local_48;
  pointer local_38;
  
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"foo.c","");
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"");
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)local_138,(string *)local_290);
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  State::State((State *)local_138);
  iVar7 = g_current_test->assertion_failures_;
  AssertParse((State *)local_138,
              "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\nbuild fo$ o.o: cc foo.c\n"
              ,(ManifestParserOptions)0x0);
  pTVar4 = g_current_test;
  if (iVar7 == g_current_test->assertion_failures_) {
    paVar2 = &local_198.file_path_.field_2;
    local_198.needs_recompaction_ = false;
    local_198.file_ = (FILE *)0x0;
    local_198.file_path_._M_string_length = 0;
    local_198.file_path_.field_2._M_local_buf[0] = '\0';
    local_198.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_198.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_290._0_8_ = local_290 + 0x10;
    local_198.file_path_._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ninja_deps","");
    bVar6 = DepsLog::OpenForWrite(&local_198,(string *)local_290,&local_2b8);
    bVar6 = testing::Test::Check
                      (pTVar4,bVar6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x946,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    pTVar4 = g_current_test;
    if (!bVar6) {
LAB_001341f5:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      DepsLog::~DepsLog(&local_198);
      goto LAB_00134206;
    }
    iVar7 = std::__cxx11::string::compare((char *)&local_2b8);
    bVar6 = testing::Test::Check
                      (pTVar4,iVar7 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x947,"\"\" == err");
    if (!bVar6) goto LAB_001341f5;
    config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
    Builder::Builder((Builder *)local_290,(State *)local_138,config,(BuildLog *)0x0,&local_198,
                     &this_00->super_DiskInterface);
    _Var10._M_head_impl =
         &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.super_CommandRunner;
    local_298 = config;
    _Var5._M_head_impl = _Var10._M_head_impl;
    if ((_Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>)
        local_210._M_head_impl != (CommandRunner *)0x0) {
      lVar3 = *(long *)local_210._M_head_impl;
      local_210._M_head_impl = _Var10._M_head_impl;
      (**(code **)(lVar3 + 8))();
      _Var5._M_head_impl = local_210._M_head_impl;
    }
    local_210._M_head_impl = _Var5._M_head_impl;
    pTVar4 = g_current_test;
    paVar1 = &local_2d8.field_2;
    local_2d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"fo o.o","");
    pNVar9 = Builder::AddTarget((Builder *)local_290,&local_2d8,&local_2b8);
    testing::Test::Check
              (pTVar4,pNVar9 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x94b,"builder.AddTarget(\"fo o.o\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = g_current_test;
    iVar7 = std::__cxx11::string::compare((char *)&local_2b8);
    bVar6 = testing::Test::Check
                      (pTVar4,iVar7 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x94c,"\"\" == err");
    if (bVar6) {
      local_2d8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"fo o.o.d","");
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"fo\\ o.o: blah.h bar.h\n","");
      VirtualFileSystem::Create(this_00,&local_2d8,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      pTVar4 = g_current_test;
      condition = Builder::Build((Builder *)local_290,&local_2b8);
      testing::Test::Check
                (pTVar4,condition,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x94e,"builder.Build(&err)");
      pTVar4 = g_current_test;
      iVar7 = std::__cxx11::string::compare((char *)&local_2b8);
      testing::Test::Check
                (pTVar4,iVar7 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x94f,"\"\" == err");
      DepsLog::Close(&local_198);
      local_210._M_head_impl = (CommandRunner *)0x0;
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    Builder::~Builder((Builder *)local_290);
    DepsLog::~DepsLog(&local_198);
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    local_b8 = &PTR__BindingEnv_001d8ce8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
    ::~_Rb_tree(&local_80);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_b0);
    if (local_d0 != (pointer)0x0) {
      operator_delete(local_d0,(long)local_c0 - (long)local_d0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
    ::~_Rb_tree(&local_100);
    std::
    _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_138);
    if (!bVar6) goto LAB_00134282;
    State::State((State *)local_138);
    iVar7 = g_current_test->assertion_failures_;
    AssertParse((State *)local_138,
                "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\nbuild fo$ o.o: cc foo.c\n"
                ,(ManifestParserOptions)0x0);
    pTVar4 = g_current_test;
    if (iVar7 == g_current_test->assertion_failures_) {
      local_198.needs_recompaction_ = false;
      local_198.file_ = (FILE *)0x0;
      local_198.file_path_._M_string_length = 0;
      local_198.file_path_.field_2._M_local_buf[0] = '\0';
      local_198.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_198.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_290._0_8_ = local_290 + 0x10;
      local_198.file_path_._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ninja_deps","");
      LVar8 = DepsLog::Load(&local_198,(string *)local_290,(State *)local_138,&local_2b8);
      bVar6 = testing::Test::Check
                        (pTVar4,LVar8 != LOAD_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x95a,"deps_log.Load(\"ninja_deps\", &state, &err)");
      if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
        operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
      }
      pTVar4 = g_current_test;
      if (bVar6) {
        local_290._0_8_ = local_290 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"ninja_deps","");
        bVar6 = DepsLog::OpenForWrite(&local_198,(string *)local_290,&local_2b8);
        bVar6 = testing::Test::Check
                          (pTVar4,bVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x95b,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
        if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
          operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
        }
        pTVar4 = g_current_test;
        if (!bVar6) goto LAB_00134752;
        iVar7 = std::__cxx11::string::compare((char *)&local_2b8);
        bVar6 = testing::Test::Check
                          (pTVar4,iVar7 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x95c,"\"\" == err");
        if (bVar6) {
          Builder::Builder((Builder *)local_290,(State *)local_138,local_298,(BuildLog *)0x0,
                           &local_198,&this_00->super_DiskInterface);
          if ((_Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>)
              local_210._M_head_impl != (CommandRunner *)0x0) {
            lVar3 = *(long *)local_210._M_head_impl;
            local_210._M_head_impl = _Var10._M_head_impl;
            (**(code **)(lVar3 + 8))();
            _Var10._M_head_impl = local_210._M_head_impl;
          }
          local_210._M_head_impl = _Var10._M_head_impl;
          this_01 = local_c8[-1];
          path.len_ = 5;
          path.str_ = "bar.h";
          pNVar9 = State::GetNode((State *)local_138,path,0);
          pNVar9->dirty_ = true;
          pTVar4 = g_current_test;
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"fo o.o","");
          pNVar9 = Builder::AddTarget((Builder *)local_290,&local_2d8,&local_2b8);
          testing::Test::Check
                    (pTVar4,pNVar9 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x964,"builder.AddTarget(\"fo o.o\", &err)");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          pTVar4 = g_current_test;
          iVar7 = std::__cxx11::string::compare((char *)&local_2b8);
          bVar6 = testing::Test::Check
                            (pTVar4,iVar7 == 0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x965,"\"\" == err");
          if ((bVar6) &&
             (bVar6 = testing::Test::Check
                                (g_current_test,(long)local_c8 - (long)local_d0 == 0x18,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x969,"3u == state.edges_.size()"), bVar6)) {
            bVar6 = testing::Test::Check
                              (g_current_test,
                               (long)(this_01->inputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this_01->inputs_).
                                     super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                     super__Vector_impl_data._M_start == 0x18,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x96b,"3u == edge->inputs_.size()");
            pTVar4 = g_current_test;
            if (bVar6) {
              Edge::EvaluateCommand_abi_cxx11_(&local_2d8,this_01,false);
              iVar7 = std::__cxx11::string::compare((char *)&local_2d8);
              bVar6 = testing::Test::Check
                                (pTVar4,iVar7 == 0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x96e,"\"cc foo.c\" == edge->EvaluateCommand()");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                operator_delete(local_2d8._M_dataplus._M_p,
                                local_2d8.field_2._M_allocated_capacity + 1);
              }
              if (bVar6) {
                DepsLog::Close(&local_198);
                local_210._M_head_impl = (CommandRunner *)0x0;
              }
              else {
                g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
              }
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
          Builder::~Builder((Builder *)local_290);
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
      else {
LAB_00134752:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      DepsLog::~DepsLog(&local_198);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00134206:
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  local_b8 = &PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  if (local_d0 != (pointer)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_100);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_138);
LAB_00134282:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepFileOKDepsLog) {
  string err;
  const char* manifest =
      "rule cc\n  command = cc $in\n  depfile = $out.d\n  deps = gcc\n"
      "build fo$ o.o: cc foo.c\n";

  fs_.Create("foo.c", "");

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("fo o.o", &err));
    ASSERT_EQ("", err);
    fs_.Create("fo o.o.d", "fo\\ o.o: blah.h bar.h\n");
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    deps_log.Close();
    builder.command_runner_.release();
  }

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);

    Edge* edge = state.edges_.back();

    state.GetNode("bar.h", 0)->MarkDirty();  // Mark bar.h as missing.
    EXPECT_TRUE(builder.AddTarget("fo o.o", &err));
    ASSERT_EQ("", err);

    // Expect three new edges: one generating fo o.o, and two more from
    // loading the depfile.
    ASSERT_EQ(3u, state.edges_.size());
    // Expect our edge to now have three inputs: foo.c and two headers.
    ASSERT_EQ(3u, edge->inputs_.size());

    // Expect the command line we generate to only use the original input.
    ASSERT_EQ("cc foo.c", edge->EvaluateCommand());

    deps_log.Close();
    builder.command_runner_.release();
  }
}